

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.hpp
# Opt level: O0

void __thiscall
boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::
queue(queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_> *this,
     size_type n)

{
  atomic<boost::lockfree::detail::tagged_index> *in_RDI;
  queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>
  *in_stack_ffffffffffffffd0;
  allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>
  *in_stack_ffffffffffffffd8;
  fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
  *in_stack_ffffffffffffffe0;
  tagged_index local_18;
  tagged_index local_14 [5];
  
  detail::tagged_index::tagged_index(local_14,0,0);
  std::atomic<boost::lockfree::detail::tagged_index>::atomic(in_RDI,local_14[0]);
  detail::tagged_index::tagged_index(&local_18,0,0);
  std::atomic<boost::lockfree::detail::tagged_index>::atomic(in_RDI + 0x10,local_18);
  std::
  allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>
  ::allocator((allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>
               *)0x1331d1);
  detail::
  fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node,std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node>>>
  ::
  fixed_size_freelist<std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::node>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(size_t)in_stack_ffffffffffffffd0);
  std::
  allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>
  ::~allocator((allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>
                *)0x1331f4);
  initialize(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

explicit queue(size_type n):
        head_(tagged_node_handle(0, 0)),
        tail_(tagged_node_handle(0, 0)),
        pool(node_allocator(), n + 1)
    {
        BOOST_ASSERT(!has_capacity);
        initialize();
    }